

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O3

void __thiscall
crypto::hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
          (hmac<crypto::iterated_hash<crypto::sha256_transform>_> *this,hash_word *ostate,char *mac)

{
  char buffer [32];
  iterated_hash<crypto::sha256_transform> outer;
  char acStack_a8 [32];
  iterated_hash<crypto::sha256_transform> local_88;
  
  iterated_hash<crypto::sha256_transform>::finalize(&this->inner,acStack_a8);
  local_88.count_lo = 0x40;
  local_88.count_hi = 0;
  local_88.state._0_8_ = *(undefined8 *)ostate;
  local_88.state._8_8_ = *(undefined8 *)(ostate + 2);
  local_88.state._16_8_ = *(undefined8 *)(ostate + 4);
  local_88.state._24_8_ = *(undefined8 *)(ostate + 6);
  iterated_hash<crypto::sha256_transform>::update(&local_88,acStack_a8,0x20);
  iterated_hash<crypto::sha256_transform>::finalize(&local_88,mac);
  return;
}

Assistant:

void finalize(const state_t ostate, char mac[hash_size]) {
		
		char buffer[hash_size];
		inner.finalize(buffer);
		
		T outer;
		outer.init(ostate, 1);
		outer.update(buffer, hash_size);
		outer.finalize(mac);
		
	}